

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

int32_t __thiscall cppnet::BufferQueue::MoveWritePt(BufferQueue *this,int32_t len)

{
  shared_ptr<cppnet::BufferBlock> *this_00;
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  int iVar4;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_50;
  int local_3c;
  BufferQueue *local_38;
  
  this_00 = &this->_buffer_write;
  local_38 = this;
  if (len < 0) {
    local_3c = -len;
    iVar4 = 0;
    while (peVar1 = (this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr, peVar1 != (element_type *)0x0) {
      iVar3 = (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                        (peVar1,(ulong)(uint)(iVar4 + len));
      iVar4 = iVar4 + iVar3;
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 &(this->_buffer_list)._head.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      peVar2 = local_50._M_ptr;
      peVar1 = (this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      if ((peVar1 == peVar2) || (local_3c <= iVar4)) break;
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 &(((this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ListSlot<cppnet::BufferBlock>)._prev);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,
                 &local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    }
  }
  else {
    iVar4 = 0;
    while (peVar1 = (this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr, peVar1 != (element_type *)0x0) {
      iVar3 = (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                        (peVar1,(ulong)(uint)(len - iVar4));
      iVar4 = iVar4 + iVar3;
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 &(this->_buffer_list)._tail.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      peVar2 = local_50._M_ptr;
      peVar1 = (this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      if ((peVar1 == peVar2) || (len <= iVar4)) break;
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 &(((this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ListSlot<cppnet::BufferBlock>)._next.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,
                 &local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    }
  }
  local_38->_can_read_length = local_38->_can_read_length + iVar4;
  return iVar4;
}

Assistant:

int32_t BufferQueue::MoveWritePt(int32_t len) {
    int32_t total_write_len = 0;
    if (len >= 0) {
        while (_buffer_write) {
            total_write_len += _buffer_write->MoveWritePt(len - total_write_len);
            if (_buffer_write == _buffer_list.GetTail() || len <= total_write_len) {
                break;
            }
            _buffer_write = _buffer_write->GetNext();
        }

    } else {
        while (_buffer_write) {
            total_write_len += _buffer_write->MoveWritePt(len + total_write_len);
            if (_buffer_write == _buffer_list.GetHead() || -len <= total_write_len) {
                break;
            }
            _buffer_write = _buffer_write->GetPrev();
        }
    }
    _can_read_length += total_write_len;
    return total_write_len;
}